

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter.cpp
# Opt level: O2

string * __thiscall
booster::locale::impl_std::utf8_converter::convert_abi_cxx11_
          (string *__return_storage_ptr__,utf8_converter *this,conversion_type how,char *begin,
          char *end,int param_4)

{
  ctype *pcVar1;
  vector<wchar_t,_std::allocator<wchar_t>_> res;
  wstring tmp;
  allocator_type local_81;
  string local_80;
  _Vector_base<wchar_t,_std::allocator<wchar_t>_> local_60;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_48;
  
  if (how - upper_case < 3) {
    std::__cxx11::string::string((string *)&local_80,"UTF-8",(allocator *)&local_60);
    conv::to_utf<wchar_t>(&local_48,begin,end,&local_80,default_method);
    std::__cxx11::string::~string((string *)&local_80);
    pcVar1 = std::use_facet<std::ctype<wchar_t>>(&this->base_);
    local_80._M_dataplus._M_p._0_4_ = 0;
    std::vector<wchar_t,_std::allocator<wchar_t>_>::vector
              ((vector<wchar_t,_std::allocator<wchar_t>_> *)&local_60,local_48._M_string_length + 1,
               (value_type_conflict1 *)&local_80,&local_81);
    if (local_48._M_string_length != 0) {
      memmove(local_60._M_impl.super__Vector_impl_data._M_start,local_48._M_dataplus._M_p,
              local_48._M_string_length * 4);
    }
    (**(code **)((ulong)(how != upper_case) * 0x10 + 0x38 + *(long *)pcVar1))
              (pcVar1,local_60._M_impl.super__Vector_impl_data._M_start,
               local_60._M_impl.super__Vector_impl_data._M_start + local_48._M_string_length);
    std::__cxx11::string::string((string *)&local_80,"UTF-8",(allocator *)&local_81);
    conv::from_utf<wchar_t>
              (__return_storage_ptr__,local_60._M_impl.super__Vector_impl_data._M_start,
               local_60._M_impl.super__Vector_impl_data._M_start + local_48._M_string_length,
               &local_80,default_method);
    std::__cxx11::string::~string((string *)&local_80);
    std::_Vector_base<wchar_t,_std::allocator<wchar_t>_>::~_Vector_base(&local_60);
    std::__cxx11::wstring::~wstring((wstring *)&local_48);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,begin,end);
  }
  return __return_storage_ptr__;
}

Assistant:

virtual std::string convert(converter_base::conversion_type how,char const *begin,char const *end,int /*flags*/ = 0) const 
    {
        switch(how) {
        case upper_case:
        case lower_case:
        case case_folding:
            {
                std::wstring tmp = conv::to_utf<wchar_t>(begin,end,"UTF-8");
                wctype_type const &ct=std::use_facet<wctype_type>(base_);
                size_t len = tmp.size();
                std::vector<wchar_t> res(len+1,0);
                wchar_t *lbegin = &res[0];
                std::copy(tmp.c_str(),tmp.c_str()+len,lbegin);
                if(how == upper_case)
                    ct.toupper(lbegin,lbegin+len);
                else
                    ct.tolower(lbegin,lbegin+len);
                return conv::from_utf<wchar_t>(lbegin,lbegin+len,"UTF-8");
            }
        default:
            return std::string(begin,end-begin);
        }
    }